

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

void __thiscall QTextCursorPrivate::setX(QTextCursorPrivate *this)

{
  bool bVar1;
  int iVar2;
  QTextLayout *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  qreal qVar3;
  QTextLine QVar4;
  int pos;
  QTextLayout *layout;
  QTextLine line;
  QTextBlock block;
  undefined4 in_stack_ffffffffffffffa8;
  Edge in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QTextCursorPrivate *in_stack_ffffffffffffffc8;
  undefined1 *local_28;
  QTextEngine *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QTextDocumentPrivate::isInEditBlock(*(QTextDocumentPrivate **)(in_RDI + 8));
  if ((bVar1) || ((*(byte *)(*(long *)(in_RDI + 8) + 0x1cc) & 1) != 0)) {
    *(undefined8 *)(in_RDI + 0x10) = 0xbff0000000000000;
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursorPrivate::block(in_stack_ffffffffffffffc8);
    this_00 = blockLayout(in_stack_ffffffffffffffc8,
                          (QTextBlock *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar5 = *(int *)(in_RDI + 0x18);
    iVar2 = QTextBlock::position
                      ((QTextBlock *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QVar4 = QTextLayout::lineForTextPosition(this_00,iVar5 - iVar2);
    local_20 = QVar4.eng;
    local_28 = (undefined1 *)CONCAT44(local_28._4_4_,QVar4.index);
    bVar1 = QTextLine::isValid((QTextLine *)&local_28);
    if (bVar1) {
      qVar3 = QTextLine::cursorToX
                        ((QTextLine *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),
                         (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffac);
      *(qreal *)(in_RDI + 0x10) = qVar3;
    }
    else {
      *(undefined8 *)(in_RDI + 0x10) = 0xbff0000000000000;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursorPrivate::setX()
{
    if (priv->isInEditBlock() || priv->inContentsChange) {
        x = -1; // mark dirty
        return;
    }

    QTextBlock block = this->block();
    const QTextLayout *layout = blockLayout(block);
    int pos = position - block.position();

    QTextLine line = layout->lineForTextPosition(pos);
    if (line.isValid())
        x = line.cursorToX(pos);
    else
        x = -1; // delayed init.  Makes movePosition() call setX later on again.
}